

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout_p.h
# Opt level: O2

uint qConvertRgb64ToRgb30<(QtPixelOrder)1>(QRgba64 c)

{
  QRgba64 QVar1;
  
  QVar1 = qRepremultiply<14u>(c);
  return (uint)(QVar1.rgba >> 0x12) & 0x3ff00000 | (uint)(QVar1.rgba >> 0x20) & 0xc0000000 |
         (uint)QVar1.rgba >> 0xc & 0xffc00 | (uint)(QVar1.rgba >> 6) & 0x3ff;
}

Assistant:

inline unsigned int qConvertRgb64ToRgb30<PixelOrderBGR>(QRgba64 c)
{
    c = qRepremultiply<14>(c);
    const uint a = c.alpha() >> 14;
    const uint r = c.red()   >> 6;
    const uint g = c.green() >> 6;
    const uint b = c.blue()  >> 6;
    return (a << 30) | (b << 20) | (g << 10) | r;
}